

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

RequiredExtensions *
deqp::gls::TextureStateQueryTests::anon_unknown_1::getQueryExtension
          (RequiredExtensions *__return_storage_ptr__,ContextType *contextType,QueryType query)

{
  ContextType CVar1;
  bool bVar2;
  ApiType AVar3;
  QueryType query_local;
  ContextType *contextType_local;
  
  CVar1 = (ContextType)(contextType->super_ApiType).m_bits;
  AVar3 = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(CVar1,AVar3);
  if (bVar2) {
    es32::getQueryExtension(__return_storage_ptr__,query);
  }
  else {
    CVar1 = (ContextType)(contextType->super_ApiType).m_bits;
    AVar3 = glu::ApiType::es(3,1);
    bVar2 = glu::contextSupports(CVar1,AVar3);
    if (bVar2) {
      es31::getQueryExtension(__return_storage_ptr__,query);
    }
    else {
      CVar1 = (ContextType)(contextType->super_ApiType).m_bits;
      AVar3 = glu::ApiType::es(3,0);
      bVar2 = glu::contextSupports(CVar1,AVar3);
      if (bVar2) {
        es30::getQueryExtension(__return_storage_ptr__,query);
      }
      else {
        RequiredExtensions::RequiredExtensions(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static RequiredExtensions getQueryExtension (const glu::ContextType& contextType, QueryType query)
{
	DE_ASSERT(!isCoreQuery(contextType, query));

	if (contextSupports(contextType, glu::ApiType::es(3,2)))
		return es32::getQueryExtension(query);
	else if (contextSupports(contextType, glu::ApiType::es(3,1)))
		return es31::getQueryExtension(query);
	else if (contextSupports(contextType, glu::ApiType::es(3,0)))
		return es30::getQueryExtension(query);
	else
	{
		DE_ASSERT(false);
		return RequiredExtensions();
	}
}